

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

CTcPrsNode * CTcPrsOpUnary::eval_const_not(CTcPrsNode *subexpr)

{
  int iVar1;
  CTcConstVal *this;
  CTcConstVal *in_RDI;
  undefined8 local_8;
  
  iVar1 = CTcPrsNodeBase::is_const((CTcPrsNodeBase *)0x2aa013);
  if (iVar1 == 0) {
    local_8 = (CTcConstVal *)0x0;
  }
  else {
    this = (CTcConstVal *)(**(code **)(*(long *)in_RDI + 8))();
    (**(code **)(*(long *)in_RDI + 8))();
    iVar1 = CTcConstVal::get_val_bool(in_RDI);
    CTcConstVal::set_bool(this,(uint)((iVar1 != 0 ^ 0xffU) & 1));
    local_8 = in_RDI;
  }
  return (CTcPrsNode *)local_8;
}

Assistant:

CTcPrsNode *CTcPrsOpUnary::eval_const_not(CTcPrsNode *subexpr)
{
    /* 
     *   if the underlying expression is a constant value, apply the
     *   operator 
     */
    if (subexpr->is_const())
    {
        /* set the new value */
        subexpr->get_const_val()
            ->set_bool(!subexpr->get_const_val()->get_val_bool());

        /* return the modified constant value */
        return subexpr;
    }

    /* the result is not constant */
    return 0;
}